

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

bool __thiscall
Clasp::Cli::ClaspCliConfig::setConfig
          (ClaspCliConfig *this,ConfigIter *config,uint8 mode,uint32 sId,ParsedOpts *exclude,
          ParsedOpts *out)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ConfigIter *in_RSI;
  ParsedOpts *in_stack_00000010;
  uint32 in_stack_00000018;
  uint8 in_stack_0000001f;
  char *in_stack_00000020;
  char *in_stack_00000028;
  ClaspCliConfig *in_stack_00000030;
  ConfigIter base;
  ParsedOpts *in_stack_00000040;
  ConfigKey baseK;
  ConfigKey *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ConfigKey in_stack_ffffffffffffff9c;
  ConfigIter local_40;
  undefined4 local_34;
  ConfigIter *local_18;
  
  local_18 = in_RSI;
  pcVar2 = ConfigIter::base((ConfigIter *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (*pcVar2 != '\0') {
    local_34 = 0;
    ConfigIter::base((ConfigIter *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar1 = Potassco::stringTo<Clasp::Cli::ConfigKey>
                      ((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
    if (!bVar1) {
      pcVar2 = ConfigIter::name(local_18);
      pcVar3 = ConfigIter::base((ConfigIter *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      Potassco::fail(-2,
                     "bool Clasp::Cli::ClaspCliConfig::setConfig(const ConfigIter &, uint8, uint32, const ParsedOpts &, ParsedOpts *)"
                     ,0x457,"Potassco::stringTo(config.base(), baseK)",
                     "%s: \'%s\': Invalid base config!",pcVar2,pcVar3,0);
    }
    local_40 = getConfig(in_stack_ffffffffffffff9c);
    ConfigIter::name(&local_40);
    ConfigIter::args((ConfigIter *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar1 = setConfig(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001f,
                      in_stack_00000018,in_stack_00000010,in_stack_00000040);
    if (!bVar1) {
      return false;
    }
  }
  ConfigIter::name(local_18);
  ConfigIter::args((ConfigIter *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  bVar1 = setConfig(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001f,
                    in_stack_00000018,in_stack_00000010,in_stack_00000040);
  return bVar1;
}

Assistant:

bool ClaspCliConfig::setConfig(const ConfigIter& config, uint8 mode, uint32 sId, const ParsedOpts& exclude, ParsedOpts* out) {
	if (*config.base()) {
		ConfigKey baseK = config_default;
		POTASSCO_REQUIRE(Potassco::stringTo(config.base(), baseK), "%s: '%s': Invalid base config!", config.name(), config.base());
		ConfigIter base = getConfig(baseK);
		if (!setConfig(base.name(), base.args(), mode | mode_solver, sId, exclude, out)) {
			return false;
		}
	}
	return setConfig(config.name(), config.args(), mode, sId, exclude, out);
}